

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

fixup_entry * new_fixup(archive_write_disk *a,char *pathname)

{
  char *pcVar1;
  fixup_entry *fe;
  char *pathname_local;
  archive_write_disk *a_local;
  
  a_local = (archive_write_disk *)calloc(1,0xb0);
  if (a_local == (archive_write_disk *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory for a fixup");
    a_local = (archive_write_disk *)0x0;
  }
  else {
    *(fixup_entry **)&a_local->archive = a->fixup_list;
    a->fixup_list = (fixup_entry *)a_local;
    *(wchar_t *)&a_local->current_fixup = L'\0';
    *(undefined4 *)((long)&(a_local->archive).error_string.buffer_length + 4) = 0;
    pcVar1 = strdup(pathname);
    a_local->user_uid = (int64_t)pcVar1;
  }
  return (fixup_entry *)a_local;
}

Assistant:

static struct fixup_entry *
new_fixup(struct archive_write_disk *a, const char *pathname)
{
	struct fixup_entry *fe;

	fe = calloc(1, sizeof(struct fixup_entry));
	if (fe == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for a fixup");
		return (NULL);
	}
	fe->next = a->fixup_list;
	a->fixup_list = fe;
	fe->fixup = 0;
	fe->filetype = 0;
	fe->name = strdup(pathname);
	return (fe);
}